

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen.cpp
# Opt level: O3

void Omega_h::filter_coarsen_candidates
               (LOs *cands2edges,Read<signed_char> *cand_codes,Reals *cand_quals)

{
  int *piVar1;
  Alloc *pAVar2;
  LOs new2old;
  Bytes keep;
  Read<signed_char> local_108;
  Alloc *local_f8;
  void *local_f0;
  LOs local_e8;
  LOs local_d8;
  LOs local_c8;
  Read<signed_char> local_b8;
  Read<signed_char> local_a8;
  Read<int> local_98;
  Read<signed_char> local_88;
  Write<double> local_78;
  Write<signed_char> local_68;
  Write<int> local_58;
  Read<signed_char> local_48;
  Alloc *local_38;
  void *local_30;
  
  local_48.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.write_.shared_alloc_.alloc)->use_count =
           (local_48.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
  each_neq_to<signed_char>((Omega_h *)&local_38,&local_48,'\0');
  pAVar2 = local_48.write_.shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_88.write_.shared_alloc_.alloc = local_38;
  if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.write_.shared_alloc_.alloc = (Alloc *)(local_38->size * 8 + 1);
    }
    else {
      local_38->use_count = local_38->use_count + 1;
    }
  }
  local_88.write_.shared_alloc_.direct_ptr = local_30;
  collect_marked((Omega_h *)&local_f8,&local_88);
  pAVar2 = local_88.write_.shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_c8.write_.shared_alloc_.alloc = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8.write_.shared_alloc_.alloc = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  local_c8.write_.shared_alloc_.direct_ptr = local_f0;
  local_98.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc =
           (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_98.write_.shared_alloc_.alloc)->use_count =
           (local_98.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
  unmap<int>((Omega_h *)&local_58,&local_c8,&local_98,1);
  Read<int>::Read(&local_108,&local_58);
  pAVar2 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  (cands2edges->write_).shared_alloc_.alloc = local_108.write_.shared_alloc_.alloc;
  (cands2edges->write_).shared_alloc_.direct_ptr = local_108.write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
       local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_108.write_.shared_alloc_.alloc)->use_count =
         (local_108.write_.shared_alloc_.alloc)->use_count + -1;
    (cands2edges->write_).shared_alloc_.alloc =
         (Alloc *)((local_108.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_108.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_108.write_.shared_alloc_.direct_ptr = (void *)0x0;
  if (((ulong)local_58.shared_alloc_.alloc & 7) == 0 && local_58.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_58.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.shared_alloc_.alloc);
      operator_delete(local_58.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_c8.write_.shared_alloc_.alloc;
  if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_d8.write_.shared_alloc_.alloc = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8.write_.shared_alloc_.alloc = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  local_d8.write_.shared_alloc_.direct_ptr = local_f0;
  local_a8.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.write_.shared_alloc_.alloc =
           (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a8.write_.shared_alloc_.alloc)->use_count =
           (local_a8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
  unmap<signed_char>((Omega_h *)&local_68,&local_d8,&local_a8,1);
  Read<signed_char>::Read(&local_108,&local_68);
  pAVar2 = (cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  (cand_codes->write_).shared_alloc_.alloc = local_108.write_.shared_alloc_.alloc;
  (cand_codes->write_).shared_alloc_.direct_ptr = local_108.write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
       local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_108.write_.shared_alloc_.alloc)->use_count =
         (local_108.write_.shared_alloc_.alloc)->use_count + -1;
    (cand_codes->write_).shared_alloc_.alloc =
         (Alloc *)((local_108.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_108.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_108.write_.shared_alloc_.direct_ptr = (void *)0x0;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(local_68.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_a8.write_.shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_d8.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (cand_quals != (Reals *)0x0) {
    local_e8.write_.shared_alloc_.alloc = local_f8;
    if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e8.write_.shared_alloc_.alloc = (Alloc *)(local_f8->size * 8 + 1);
      }
      else {
        local_f8->use_count = local_f8->use_count + 1;
      }
    }
    local_e8.write_.shared_alloc_.direct_ptr = local_f0;
    local_b8.write_.shared_alloc_.alloc = (cand_quals->write_).shared_alloc_.alloc;
    if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.write_.shared_alloc_.alloc =
             (Alloc *)((local_b8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b8.write_.shared_alloc_.alloc)->use_count =
             (local_b8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b8.write_.shared_alloc_.direct_ptr = (cand_quals->write_).shared_alloc_.direct_ptr;
    unmap<double>((Omega_h *)&local_78,&local_e8,&local_b8,2);
    Read<double>::Read(&local_108,&local_78);
    pAVar2 = (cand_quals->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
      piVar1 = &pAVar2->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar2);
        operator_delete(pAVar2,0x48);
      }
    }
    (cand_quals->write_).shared_alloc_.alloc = local_108.write_.shared_alloc_.alloc;
    (cand_quals->write_).shared_alloc_.direct_ptr = local_108.write_.shared_alloc_.direct_ptr;
    if ((((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
         local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_108.write_.shared_alloc_.alloc)->use_count =
           (local_108.write_.shared_alloc_.alloc)->use_count + -1;
      (cand_quals->write_).shared_alloc_.alloc =
           (Alloc *)((local_108.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_108.write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_108.write_.shared_alloc_.direct_ptr = (void *)0x0;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.shared_alloc_.alloc);
        operator_delete(local_78.shared_alloc_.alloc,0x48);
      }
    }
    pAVar2 = local_b8.write_.shared_alloc_.alloc;
    if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_e8.write_.shared_alloc_.alloc;
    if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
  }
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    piVar1 = &local_f8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_f8);
      operator_delete(local_f8,0x48);
    }
  }
  if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
    piVar1 = &local_38->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38);
      operator_delete(local_38,0x48);
    }
  }
  return;
}

Assistant:

static void filter_coarsen_candidates(
    LOs* cands2edges, Read<I8>* cand_codes, Reals* cand_quals = nullptr) {
  auto keep = each_neq_to(*cand_codes, I8(DONT_COLLAPSE));
  auto new2old = collect_marked(keep);
  *cands2edges = unmap(new2old, *cands2edges, 1);
  *cand_codes = unmap(new2old, *cand_codes, 1);
  if (cand_quals) *cand_quals = unmap(new2old, *cand_quals, 2);
}